

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit-model-multi.cpp
# Opt level: O2

WeightedIsomapAveraging * __thiscall
WeightedIsomapAveraging::add_and_merge(WeightedIsomapAveraging *this,Mat *isomap)

{
  Mat MVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  int r;
  long lVar7;
  long in_RDX;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  undefined4 local_48 [2];
  WeightedIsomapAveraging *local_40;
  undefined8 local_38;
  
  for (lVar7 = 0; lVar7 < *(int *)(in_RDX + 8); lVar7 = lVar7 + 1) {
    lVar2 = *(long *)(in_RDX + 0x10);
    plVar3 = *(long **)(in_RDX + 0x48);
    MVar1 = isomap[0xc0];
    plVar4 = *(long **)(isomap + 0xa8);
    lVar5 = *(long *)(isomap + 0x10);
    plVar6 = *(long **)(isomap + 0x48);
    lVar10 = *(long *)(isomap + 0x70) + 8;
    for (lVar13 = 0; lVar13 < *(int *)(in_RDX + 0xc); lVar13 = lVar13 + 1) {
      lVar11 = *plVar3 * lVar7 + lVar2 + 1;
      if ((byte)MVar1 < (byte)*(Mat *)(lVar11 + 2 + lVar13 * 4)) {
        lVar12 = *plVar6 * lVar7 + lVar5;
        iVar9 = *(int *)(lVar12 + lVar13 * 4);
        fVar14 = (float)iVar9;
        lVar8 = *plVar4 * lVar7;
        iVar9 = iVar9 + 1;
        fVar15 = (float)iVar9;
        *(float *)(lVar10 + -8 + lVar8) =
             (*(float *)(lVar10 + -8 + lVar8) * fVar14 + (float)*(byte *)(lVar11 + -1 + lVar13 * 4))
             / fVar15;
        *(float *)(lVar10 + -4 + lVar8) =
             (*(float *)(lVar10 + -4 + lVar8) * fVar14 + (float)*(byte *)(lVar11 + lVar13 * 4)) /
             fVar15;
        *(float *)(lVar10 + lVar8) =
             (fVar14 * *(float *)(lVar10 + lVar8) + (float)*(byte *)(lVar11 + 1 + lVar13 * 4)) /
             fVar15;
        *(undefined4 *)(lVar10 + 4 + lVar8) = 0x437f0000;
        *(int *)(lVar12 + lVar13 * 4) = iVar9;
      }
      lVar10 = lVar10 + 0x10;
    }
  }
  cv::Mat::Mat(&this->visibility_counter);
  local_38 = 0;
  local_48[0] = 0x2010000;
  local_40 = this;
  cv::Mat::convertTo((_OutputArray *)(isomap + 0x60),(int)local_48,1.0,0.0);
  return this;
}

Assistant:

cv::Mat add_and_merge(const cv::Mat& isomap)
    {
        // Merge isomaps, add the current to the already merged, pixel by pixel:
        for (int r = 0; r < isomap.rows; ++r)
        {
            for (int c = 0; c < isomap.cols; ++c)
            {
                if (isomap.at<cv::Vec4b>(r, c)[3] <= threshold)
                {
                    continue; // ignore this pixel, not visible in the extracted isomap of this current frame
                }
                // we're sure to have a visible pixel, merge it:
                // merged_pixel = (old_average * visible_count + new_pixel) / (visible_count + 1)
                merged_isomap.at<cv::Vec4f>(r, c)[0] = (merged_isomap.at<cv::Vec4f>(r, c)[0] * visibility_counter.at<int>(r, c) + isomap.at<cv::Vec4b>(r, c)[0]) / (visibility_counter.at<int>(r, c) + 1);
                merged_isomap.at<cv::Vec4f>(r, c)[1] = (merged_isomap.at<cv::Vec4f>(r, c)[1] * visibility_counter.at<int>(r, c) + isomap.at<cv::Vec4b>(r, c)[1]) / (visibility_counter.at<int>(r, c) + 1);
                merged_isomap.at<cv::Vec4f>(r, c)[2] = (merged_isomap.at<cv::Vec4f>(r, c)[2] * visibility_counter.at<int>(r, c) + isomap.at<cv::Vec4b>(r, c)[2]) / (visibility_counter.at<int>(r, c) + 1);
                merged_isomap.at<cv::Vec4f>(r, c)[3] = 255; // as soon as we've seen the pixel visible once, we set it to visible.
                ++visibility_counter.at<int>(r, c);
            }
        }
        cv::Mat merged_isomap_uchar;
        merged_isomap.convertTo(merged_isomap_uchar, CV_8UC4);
        return merged_isomap_uchar;
    }